

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_pcg_serial.c
# Opt level: O2

int PSolve(void *Data,N_Vector r_vec,N_Vector z_vec,sunrealtype tol,int lr)

{
  double dVar1;
  int iVar2;
  void *flagvalue;
  void *flagvalue_00;
  void *flagvalue_01;
  void *flagvalue_02;
  long lVar3;
  long lVar4;
  int iVar5;
  
  flagvalue = (void *)N_VGetArrayPointer(r_vec);
  iVar2 = check_flag(flagvalue,"N_VGetArrayPointer",0);
  iVar5 = 1;
  if (iVar2 == 0) {
    flagvalue_00 = (void *)N_VGetArrayPointer(z_vec);
    iVar2 = check_flag(flagvalue_00,"N_VGetArrayPointer",0);
    if (iVar2 == 0) {
      flagvalue_01 = (void *)N_VGetArrayPointer(*(undefined8 *)((long)Data + 8));
      iVar2 = check_flag(flagvalue_01,"N_VGetArrayPointer",0);
      if (iVar2 == 0) {
        flagvalue_02 = (void *)N_VGetArrayPointer(*(undefined8 *)((long)Data + 0x10));
        iVar2 = check_flag(flagvalue_02,"N_VGetArrayPointer",0);
        if (iVar2 == 0) {
          iVar5 = 0;
          lVar3 = *Data;
          if (*Data < 1) {
            lVar3 = 0;
          }
          for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
            dVar1 = *(double *)((long)flagvalue_02 + lVar4 * 8);
            *(double *)((long)flagvalue_00 + lVar4 * 8) =
                 (dVar1 * dVar1 * *(double *)((long)flagvalue + lVar4 * 8)) /
                 *(double *)((long)flagvalue_01 + lVar4 * 8);
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int PSolve(void* Data, N_Vector r_vec, N_Vector z_vec, sunrealtype tol, int lr)
{
  /* local variables */
  sunrealtype *r, *z, *d, *s;
  sunindextype i;
  UserData* ProbData;

  /* access user data structure and vector data */
  ProbData = (UserData*)Data;
  r        = N_VGetArrayPointer(r_vec);
  if (check_flag(r, "N_VGetArrayPointer", 0)) { return 1; }
  z = N_VGetArrayPointer(z_vec);
  if (check_flag(z, "N_VGetArrayPointer", 0)) { return 1; }
  d = N_VGetArrayPointer(ProbData->d);
  if (check_flag(d, "N_VGetArrayPointer", 0)) { return 1; }
  s = N_VGetArrayPointer(ProbData->s);
  if (check_flag(s, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate through domain, performing Jacobi solve */
  for (i = 0; i < ProbData->N; i++) { z[i] = s[i] * s[i] * r[i] / d[i]; }

  /* return with success */
  return 0;
}